

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

uint8_t __thiscall llvm::DWARFContext::getCUAddrSize(DWARFContext *this)

{
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *this_00;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar1;
  pointer this_01;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_20;
  unit_iterator_range *__range1;
  DWARFContext *pDStack_10;
  uint8_t Addr;
  DWARFContext *this_local;
  
  __range1._7_1_ = '\0';
  pDStack_10 = this;
  ___begin1 = compile_units(this);
  local_20 = (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
              *)&__begin1;
  this_00 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
            ::begin(local_20);
  puVar1 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::end(local_20);
  if (this_00 != puVar1) {
    this_01 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                        (this_00);
    __range1._7_1_ = DWARFUnit::getAddressByteSize(this_01);
  }
  return __range1._7_1_;
}

Assistant:

uint8_t DWARFContext::getCUAddrSize() {
  // In theory, different compile units may have different address byte
  // sizes, but for simplicity we just use the address byte size of the
  // last compile unit. In practice the address size field is repeated across
  // various DWARF headers (at least in version 5) to make it easier to dump
  // them independently, not to enable varying the address size.
  uint8_t Addr = 0;
  for (const auto &CU : compile_units()) {
    Addr = CU->getAddressByteSize();
    break;
  }
  return Addr;
}